

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1bf255::SymlinkCommand::execute
          (SymlinkCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          ResultFn *resultFn)

{
  BuildNode *pBVar1;
  path *this_00;
  _func_int *p_Var2;
  long lVar3;
  undefined8 *puVar4;
  char cVar5;
  string *psVar6;
  char *pcVar7;
  BuildEngineDelegate *pBVar8;
  long *plVar9;
  uint64_t *puVar10;
  long *plVar11;
  char *pcVar12;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  StringRef SVar13;
  FileInfo outputInfo;
  BuildValue local_138;
  BuildSystem *local_c8;
  _Any_data *local_c0;
  void *local_b8;
  void *local_b0;
  string *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  FileInfo local_80;
  
  pcVar12 = (char *)(this->linkOutputPath)._M_string_length;
  if (pcVar12 == (char *)0x0) {
    pBVar1 = *(this->super_Command).outputs.
              super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (char *)(pBVar1->super_Node).name._M_string_length;
    psVar6 = &(pBVar1->super_Node).name;
  }
  else {
    psVar6 = &this->linkOutputPath;
  }
  if (((this->super_Command).outputs.
       super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->super_Command).outputs.
       super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (pcVar12 == (char *)0x0)) {
    local_138.kind = FailedCommand;
    local_138.numOutputInfos = 0;
    local_138._0_8_ = (undefined8 *)0xb;
    local_138.signature.value._0_4_ = 0;
    local_138.signature.value._4_4_ = 0;
    local_138.valueData.asOutputInfo.device._0_4_ = 0;
    local_138.valueData.asOutputInfo.device._4_4_ = 0;
    local_138.valueData.asOutputInfo.inode._0_4_ = 0;
    local_138.valueData._12_8_ = 0;
    local_138.valueData._20_8_ = 0;
    local_138.valueData._28_8_ = 0;
    local_138.valueData._36_8_ = 0;
    local_138.valueData._44_8_ = 0;
    local_138.valueData._52_8_ = 0;
    local_138.valueData._60_8_ = 0;
    local_138.valueData._68_8_ = 0;
    local_138.valueData._76_4_ = 0;
    local_138.stringValues.contents._0_4_ = 0;
    local_138.stringValues.contents._4_4_ = 0;
    local_138.stringValues.size = 0;
    if ((resultFn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00160457;
    (*resultFn->_M_invoker)((_Any_data *)resultFn,&local_138);
    goto LAB_0016043d;
  }
  this_00 = (path *)(psVar6->_M_dataplus)._M_p;
  plVar9 = *(long **)((long)system->impl + 0x10);
  SVar13.Length = 2;
  SVar13.Data = pcVar12;
  local_c0 = (_Any_data *)resultFn;
  local_b8 = ti.impl;
  local_b0 = ti.ctx;
  SVar13 = llvm::sys::path::parent_path(this_00,SVar13,(Style)ti.ctx);
  pcVar7 = SVar13.Data;
  local_c8 = system;
  if (SVar13.Length != 0) {
    puVar4 = (undefined8 *)&local_138.valueData;
    local_138._0_8_ = puVar4;
    if (pcVar7 == (char *)0x0) {
      local_138.signature.value._0_4_ = 0;
      local_138.signature.value._4_4_ = 0;
      local_138.valueData.asOutputInfo.device._0_4_ =
           local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,pcVar7,pcVar7 + SVar13.Length);
    }
    (**(code **)(*plVar9 + 0x18))(plVar9,&local_138);
    if ((undefined8 *)local_138._0_8_ != puVar4) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
  }
  plVar11 = *(long **)((long)local_c8->impl + 8);
  (**(code **)(*plVar11 + 0x50))(plVar11,this);
  local_a8 = &this->contents;
  local_138._0_8_ = &local_138.valueData;
  if (this_00 == (path *)0x0) {
    local_138.signature.value._0_4_ = 0;
    local_138.signature.value._4_4_ = 0;
    local_138.valueData.asOutputInfo.device._0_4_ =
         local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,this_00,pcVar12 + (long)this_00);
  }
  cVar5 = (**(code **)(*plVar9 + 0x48))(plVar9,local_a8,&local_138);
  puVar4 = (undefined8 *)&local_138.valueData;
  if ((undefined8 *)local_138._0_8_ != puVar4) {
    operator_delete((void *)local_138._0_8_,
                    CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                             local_138.valueData.asOutputInfo.device._0_4_) + 1);
  }
  if (cVar5 == '\0') {
    local_138._0_8_ = puVar4;
    if (this_00 == (path *)0x0) {
      local_138.signature.value._0_4_ = 0;
      local_138.signature.value._4_4_ = 0;
      local_138.valueData.asOutputInfo.device._0_4_ =
           local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,this_00,pcVar12 + (long)this_00);
    }
    (**(code **)(*plVar9 + 0x28))(plVar9,&local_138);
    if ((undefined8 *)local_138._0_8_ != puVar4) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
    psVar6 = local_a8;
    if (this_00 == (path *)0x0) {
      local_138.signature.value._0_4_ = 0;
      local_138.signature.value._4_4_ = 0;
      local_138.valueData.asOutputInfo.device._0_4_ =
           local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
    }
    else {
      local_138._0_8_ = puVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,this_00,pcVar12 + (long)this_00);
      puVar4 = (undefined8 *)local_138._0_8_;
    }
    local_138._0_8_ = puVar4;
    cVar5 = (**(code **)(*plVar9 + 0x48))(plVar9,psVar6,&local_138);
    if ((anon_union_80_2_ecfed234_for_valueData *)local_138._0_8_ != &local_138.valueData) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
    if (cVar5 != '\0') goto LAB_001601c0;
    local_138.kind = (Kind)local_b8;
    local_138.numOutputInfos = (uint32_t)((ulong)local_b8 >> 0x20);
    local_138.signature.value._0_4_ = SUB84(local_b0,0);
    local_138.signature.value._4_4_ = (undefined4)((ulong)local_b0 >> 0x20);
    pBVar8 = llbuild::core::TaskInterface::delegate((TaskInterface *)&local_138);
    p_Var2 = pBVar8[1]._vptr_BuildEngineDelegate[1];
    local_a0 = &local_90;
    if (this_00 == (path *)0x0) {
      local_98 = 0;
      local_90 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,this_00,pcVar12 + (long)this_00);
    }
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1ff7a9);
    puVar10 = (uint64_t *)(plVar9 + 2);
    if ((uint64_t *)*plVar9 == puVar10) {
      local_80.mode = *puVar10;
      local_80.size = plVar9[3];
      local_80.device = (uint64_t)&local_80.mode;
    }
    else {
      local_80.mode = *puVar10;
      local_80.device = (uint64_t)*plVar9;
    }
    local_80.inode = plVar9[1];
    *plVar9 = (long)puVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_80);
    plVar11 = plVar9 + 2;
    if ((long *)*plVar9 == plVar11) {
      local_138.valueData.asOutputInfo.device._0_4_ = (undefined4)*plVar11;
      local_138.valueData.asOutputInfo.device._4_4_ = *(undefined4 *)((long)plVar9 + 0x14);
      local_138.valueData.asOutputInfo.inode._0_4_ = (undefined4)plVar9[3];
      local_138.valueData.asOutputInfo.inode._4_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
      local_138._0_8_ = &local_138.valueData;
    }
    else {
      local_138.valueData.asOutputInfo.device._0_4_ = (undefined4)*plVar11;
      local_138.valueData.asOutputInfo.device._4_4_ = (undefined4)((ulong)*plVar11 >> 0x20);
      local_138._0_8_ = (long *)*plVar9;
    }
    lVar3 = plVar9[1];
    local_138.signature.value._0_4_ = (undefined4)lVar3;
    local_138.signature.value._4_4_ = (undefined4)((ulong)lVar3 >> 0x20);
    *plVar9 = (long)plVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    (**(code **)(*(long *)p_Var2 + 0x58))(p_Var2,this,local_138._0_8_,lVar3);
    if ((anon_union_80_2_ecfed234_for_valueData *)local_138._0_8_ != &local_138.valueData) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
    if ((uint64_t *)local_80.device != &local_80.mode) {
      operator_delete((void *)local_80.device,local_80.mode + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
    }
    plVar9 = *(long **)((long)local_c8->impl + 8);
    (**(code **)(*plVar9 + 0x70))(plVar9,this,1);
    local_138._0_8_ = (undefined8 *)0xb;
    local_138.signature.value._0_4_ = 0;
    local_138.signature.value._4_4_ = 0;
    local_138.valueData.asOutputInfo.device._0_4_ = 0;
    local_138.valueData.asOutputInfo.device._4_4_ = 0;
    local_138.valueData.asOutputInfo.inode._0_4_ = 0;
    local_138.valueData._12_8_ = 0;
    local_138.valueData._20_8_ = 0;
    local_138.valueData._28_8_ = 0;
    local_138.valueData._36_8_ = 0;
    local_138.valueData._44_8_ = 0;
    local_138.valueData._52_8_ = 0;
    local_138.valueData._60_8_ = 0;
    local_138.valueData._68_8_ = 0;
    local_138.valueData._76_4_ = 0;
    local_138.stringValues.contents._0_4_ = 0;
    local_138.stringValues.contents._4_4_ = 0;
    local_138.stringValues.size = 0;
  }
  else {
LAB_001601c0:
    puVar4 = (undefined8 *)&local_138.valueData;
    plVar11 = *(long **)((long)local_c8->impl + 8);
    (**(code **)(*plVar11 + 0x70))(plVar11,this,0);
    local_138._0_8_ = puVar4;
    if (this_00 == (path *)0x0) {
      local_138.signature.value._0_4_ = 0;
      local_138.signature.value._4_4_ = 0;
      local_138.valueData.asOutputInfo.device._0_4_ =
           local_138.valueData.asOutputInfo.device._0_4_ & 0xffffff00;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,this_00,pcVar12 + (long)this_00);
    }
    (**(code **)(*plVar9 + 0x40))(&local_80,plVar9,&local_138);
    if ((undefined8 *)local_138._0_8_ != puVar4) {
      operator_delete((void *)local_138._0_8_,
                      CONCAT44(local_138.valueData.asOutputInfo.device._4_4_,
                               local_138.valueData.asOutputInfo.device._0_4_) + 1);
    }
    outputInfos.Length = 1;
    outputInfos.Data = &local_80;
    llbuild::buildsystem::BuildValue::BuildValue
              (&local_138,SuccessfulCommand,outputInfos,(CommandSignature)0x0);
  }
  if (*(long *)(local_c0 + 1) == 0) {
LAB_00160457:
    std::__throw_bad_function_call();
  }
  (**(code **)(local_c0->_M_pod_data + 0x18))(local_c0,&local_138);
LAB_0016043d:
  llbuild::buildsystem::BuildValue::~BuildValue(&local_138);
  return;
}

Assistant:

virtual void execute(BuildSystem& system,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // It is an error if this command isn't configured properly.
    StringRef outputPath = getActualOutputPath();
    if (outputs.empty() || outputPath.empty()) {
      resultFn(BuildValue::makeFailedCommand());
      return;
    }

    auto& fs = system.getFileSystem();

    // Create the directory containing the symlink, if necessary.
    //
    // FIXME: Shared behavior with ExternalCommand.
    {
      auto parent = llvm::sys::path::parent_path(outputPath);
      if (!parent.empty()) {
        (void) fs.createDirectories(parent);
      }
    }

    // Create the symbolic link (note that despite the poorly chosen LLVM
    // name, this is a symlink).
    system.getDelegate().commandStarted(this);
    auto success = true;
    if (!fs.createSymlink(contents, outputPath.str())) {
      // On failure, we attempt to unlink the file and retry.
      fs.remove(outputPath.str());

      if (!fs.createSymlink(contents, outputPath.str())) {
        getBuildSystem(ti).getDelegate().commandHadError(this,
                       "unable to create symlink at '" + outputPath.str() + "'");
        success = false;
      }
    }
    system.getDelegate().commandFinished(this, success ? ProcessStatus::Succeeded : ProcessStatus::Failed);
    
    // Process the result.
    if (!success) {
      resultFn(BuildValue::makeFailedCommand());
      return;
    }

    // Capture the *link* information of the output.
    FileInfo outputInfo = fs.getLinkInfo(outputPath);
      
    // Complete with a successful result.
    resultFn(BuildValue::makeSuccessfulCommand(outputInfo));
  }